

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O0

void __thiscall
Inferences::Instantiation::tryMakeLiteralFalse
          (Instantiation *this,Literal *lit,Stack<Kernel::Substitution> *subs)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Term *elem;
  socklen_t in_ECX;
  Theory *in_RDX;
  Term *in_RSI;
  Instantiation *in_RDI;
  Substitution s2;
  Substitution s1;
  VariableIterator vit;
  Term *t;
  uint var;
  TermList *right;
  TermList *left;
  Interpretation itp;
  undefined4 in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  Theory *in_stack_fffffffffffffe70;
  Substitution *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  VariableIterator *in_stack_fffffffffffffe88;
  Term *in_stack_fffffffffffffed8;
  VariableIterator *in_stack_fffffffffffffee0;
  Substitution local_d0;
  undefined4 local_a4;
  TermList local_a0 [12];
  Term *local_40;
  uint local_34;
  TermList *local_30;
  TermList *local_28;
  Interpretation local_1c;
  Theory *local_18;
  
  local_18 = in_RDX;
  Kernel::Term::functor(in_RSI);
  bVar1 = Kernel::Theory::isInterpretedPredicate
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  if ((bVar1) &&
     ((((local_1c = Kernel::Theory::interpretPredicate
                              (in_stack_fffffffffffffe70,
                               (Literal *)
                               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
        local_1c == EQUAL || (local_1c == INT_LESS)) || (local_1c == RAT_LESS)) ||
      (local_1c == REAL_LESS)))) {
    local_28 = Kernel::Term::nthArgument(in_RSI,0);
    local_30 = Kernel::Term::nthArgument(in_RSI,1);
    local_40 = (Term *)0x0;
    bVar1 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffffe70);
    if ((bVar1) && (bVar1 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffffe70), !bVar1))
    {
      local_40 = Kernel::TermList::term((TermList *)0x7faad5);
      local_34 = Kernel::TermList::var(local_28);
    }
    bVar1 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffffe70);
    if ((bVar1) && (bVar1 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffffe70), !bVar1))
    {
      local_40 = Kernel::TermList::term((TermList *)0x7fab22);
      local_34 = Kernel::TermList::var(local_30);
    }
    if (local_40 != (Term *)0x0) {
      Kernel::VariableIterator::VariableIterator
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      do {
        bVar1 = Kernel::VariableIterator::hasNext(in_stack_fffffffffffffe88);
        if (!bVar1) {
          Kernel::Substitution::Substitution((Substitution *)0x7fabfb);
          Kernel::Substitution::bind(&local_d0,local_34,(sockaddr *)local_40,in_ECX);
          Kernel::Substitution::Substitution
                    ((Substitution *)in_stack_fffffffffffffe70,
                     (Substitution *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          Lib::Stack<Kernel::Substitution>::push
                    ((Stack<Kernel::Substitution> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
          Kernel::Substitution::~Substitution((Substitution *)0x7fac60);
          iVar3 = Kernel::Literal::polarity((Literal *)0x7fac6d);
          if ((iVar3 != 0) &&
             (elem = tryGetDifferentValue(in_RDI,in_RSI), local_40 = elem, elem != (Term *)0x0)) {
            Kernel::Substitution::Substitution((Substitution *)0x7facbf);
            Kernel::Substitution::bind
                      ((Substitution *)&stack0xfffffffffffffee0,local_34,(sockaddr *)local_40,in_ECX
                      );
            Kernel::Substitution::Substitution
                      ((Substitution *)local_18,
                       (Substitution *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                      );
            Lib::Stack<Kernel::Substitution>::push
                      ((Stack<Kernel::Substitution> *)CONCAT44(iVar3,in_stack_fffffffffffffe80),
                       (Substitution *)elem);
            Kernel::Substitution::~Substitution((Substitution *)0x7fad15);
            Kernel::Substitution::~Substitution((Substitution *)0x7fad1f);
            in_stack_fffffffffffffe70 = local_18;
          }
          Kernel::Substitution::~Substitution((Substitution *)0x7fadac);
          local_a4 = 0;
          goto LAB_007fadb7;
        }
        local_a0[0] = Kernel::VariableIterator::next
                                ((VariableIterator *)
                                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        uVar2 = Kernel::TermList::var(local_a0);
      } while (uVar2 != local_34);
      local_a4 = 1;
LAB_007fadb7:
      Kernel::VariableIterator::~VariableIterator((VariableIterator *)in_stack_fffffffffffffe70);
    }
  }
  return;
}

Assistant:

void Instantiation::tryMakeLiteralFalse(Literal* lit, Stack<Substitution>& subs)
{
  if(theory->isInterpretedPredicate(lit->functor())){
    Interpretation itp = theory->interpretPredicate(lit);
    //unsigned sort = theory->getOperationSort(interpretation);

    //TODO, very limited consideration, expand
    if (itp == Theory::EQUAL || itp == Theory::INT_LESS || itp == Theory::RAT_LESS || itp == Theory::REAL_LESS) {
      TermList* left = lit->nthArgument(0); TermList* right = lit->nthArgument(1);
      unsigned var;
      Term* t = 0;
      if(left->isVar() && !right->isVar()){
       t = right->term();
       var = left->var();
      }
      if(right->isVar() && !left->isVar()){
       t = left->term();
       var = right->var();
      }
      if(t){
        // do occurs check
        VariableIterator vit(t);
        while(vit.hasNext()) if(vit.next().var()==var) return;

        // we are okay
        Substitution s1;
        s1.bind(var,t);
        subs.push(s1);
        if(lit->polarity()){
         t = tryGetDifferentValue(t);
         if(t){
           Substitution s2;
           s2.bind(var,t);
           subs.push(s2);
         }
        }
      }
    }
    // TODO cover other cases ...
  }
}